

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlibemu_opl_inc.c
# Opt level: O3

void adlib_OPL2_reset(void *chip)

{
  undefined8 *puVar1;
  long lVar2;
  
  memset((void *)((long)chip + 8),0,0xc60);
  memset((void *)((long)chip + 0xc84),0,0x116);
  lVar2 = 0xb4;
  do {
    *(undefined8 *)((long)chip + lVar2 + -0x3c) = 5;
    *(undefined4 *)((long)chip + lVar2 + -0xa4) = 0;
    *(undefined4 *)((long)chip + lVar2 + -0x9c) = 0;
    puVar1 = (undefined8 *)((long)chip + lVar2 + -0x94);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)chip + lVar2 + -0x84) = 0;
    *(undefined8 *)((long)chip + lVar2 + -0x24) = 0x3ff;
    *(undefined8 *)((long)chip + lVar2 + -0x2c) = 0x2221a0;
    *(undefined4 *)((long)chip + lVar2 + -0x34) = 0;
    *(undefined4 *)((long)chip + lVar2) = 0;
    puVar1 = (undefined8 *)((long)chip + lVar2 + -0x18);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)chip + lVar2 + -0xb) = 0;
    lVar2 = lVar2 + 0xb0;
  } while (lVar2 != 0xd14);
  *(undefined4 *)((long)chip + 0xc80) = 1;
  return;
}

Assistant:

void ADLIBEMU(reset)(void *chip)
{
	OPL_DATA* OPL = (OPL_DATA*)chip;
	Bits i;
	op_type* op;
	
	memset(OPL->adlibreg, 0x00, sizeof(OPL->adlibreg));
	memset(OPL->op, 0x00, sizeof(op_type) * MAXOPERATORS);
	memset(OPL->wave_sel, 0x00, sizeof(OPL->wave_sel));
	
	for (i=0;i<MAXOPERATORS;i++)
	{
		op = &OPL->op[i];
		
		op->op_state = OF_TYPE_OFF;
		op->act_state = OP_ACT_OFF;
		op->amp = 0.0;
		op->step_amp = 0.0;
		op->vol = 0.0;
		op->tcount = 0;
		op->tinc = 0;
		op->toff = 0;
		op->cur_wmask = wavemask[0];
		op->cur_wform = &wavtable[waveform[0]];
		op->freq_high = 0;

		op->generator_pos = 0;
		op->cur_env_step = 0;
		op->env_step_a = 0;
		op->env_step_d = 0;
		op->env_step_r = 0;
		op->step_skip_pos_a = 0;
		op->env_step_skip_a = 0;

#if defined(OPLTYPE_IS_OPL3)
		op->is_4op = false;
		op->is_4op_attached = false;
		op->left_pan = 1;
		op->right_pan = 1;
#endif
	}
	
	OPL->status = 0;
	OPL->opl_addr = 0;
	OPL->isDisabled = 0x01;	// OPL4 speed hack
	
	return;
}